

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

void __thiscall
phosg::Image::draw_horizontal_line
          (Image *this,ssize_t x1,ssize_t x2,ssize_t y,ssize_t dash_length,uint64_t r,uint64_t g,
          uint64_t b,uint64_t a)

{
  out_of_range *e;
  undefined8 local_40;
  ssize_t x;
  uint64_t r_local;
  ssize_t dash_length_local;
  ssize_t y_local;
  ssize_t x2_local;
  ssize_t x1_local;
  Image *this_local;
  
  for (local_40 = x1; local_40 <= x2; local_40 = local_40 + 1) {
    if ((dash_length == 0) || ((local_40 / dash_length & 1U) == 0)) {
      write_pixel(this,local_40,y,r,g,b,a);
    }
  }
  return;
}

Assistant:

void Image::draw_horizontal_line(ssize_t x1, ssize_t x2, ssize_t y,
    ssize_t dash_length, uint64_t r, uint64_t g, uint64_t b, uint64_t a) {

  for (ssize_t x = x1; x <= x2; x++) {
    if (dash_length && ((x / dash_length) & 1)) {
      continue;
    }
    try {
      this->write_pixel(x, y, r, g, b, a);
    } catch (const out_of_range& e) {
      break;
    }
  }
}